

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<long_double>_>::Simetrize(TPZMatrix<std::complex<long_double>_> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 *puVar7;
  undefined4 extraout_var_00;
  
  lVar9 = (this->super_TPZBaseMatrix).fRow;
  if (lVar9 != (this->super_TPZBaseMatrix).fCol) {
    Error("Simetrize only work for square matrices",(char *)0x0);
    lVar9 = (this->super_TPZBaseMatrix).fRow;
  }
  lVar4 = 0;
  lVar6 = 0;
  if (0 < lVar9) {
    lVar6 = lVar9;
  }
  while (lVar10 = lVar4, lVar10 != lVar6) {
    for (lVar11 = lVar10 + 1; lVar4 = lVar10 + 1, lVar11 < lVar9; lVar11 = lVar11 + 1) {
      iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,lVar10,lVar11);
      puVar7 = (undefined8 *)CONCAT44(extraout_var,iVar5);
      iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,lVar11,lVar10);
      puVar8 = (undefined8 *)CONCAT44(extraout_var_00,iVar5);
      uVar1 = puVar7[1];
      uVar2 = puVar7[2];
      uVar3 = puVar7[3];
      *puVar8 = *puVar7;
      puVar8[1] = uVar1;
      puVar8[2] = uVar2;
      puVar8[3] = uVar3;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}